

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomColorGroup::write(DomColorGroup *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomColorRole **ppDVar2;
  DomColor **ppDVar3;
  long lVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QString local_50;
  long local_38;
  
  QVar5.field_0._4_4_ = in_register_00000034;
  QVar5.field_0._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"colorgroup";
    local_50.d.size = 10;
  }
  else {
    QString::toLower_helper(&local_50);
  }
  QVar5.m_size = (size_t)local_50.d.ptr;
  QXmlStreamWriter::writeStartElement(QVar5);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar1 = (this->m_colorRole).d.size;
  if (lVar1 != 0) {
    ppDVar2 = (this->m_colorRole).d.ptr;
    lVar4 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"colorrole";
      local_50.d.size = 9;
      DomColorRole::write(*(DomColorRole **)((long)ppDVar2 + lVar4),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  lVar1 = (this->m_color).d.size;
  if (lVar1 != 0) {
    ppDVar3 = (this->m_color).d.ptr;
    lVar4 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"color";
      local_50.d.size = 5;
      DomColor::write(*(DomColor **)((long)ppDVar3 + lVar4),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomColorGroup::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("colorgroup") : tagName.toLower());

    for (DomColorRole *v : m_colorRole)
        v->write(writer, u"colorrole"_s);

    for (DomColor *v : m_color)
        v->write(writer, u"color"_s);

    writer.writeEndElement();
}